

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O3

bool __thiscall
Rml::ElementText::GenerateLine
          (ElementText *this,String *line,int *line_length,float *line_width,int line_begin,
          float maximum_line_width,float right_spacing_width,bool trim_whitespace_prefix,
          bool decode_escape_characters,bool allow_empty)

{
  byte *pbVar1;
  uint uVar2;
  pointer pcVar3;
  size_type sVar4;
  code *pcVar5;
  bool bVar6;
  Character CVar7;
  int iVar8;
  FontFaceHandle FVar9;
  ComputedValues *this_00;
  FontEngineInterface *pFVar10;
  byte *string_end;
  Element *pEVar11;
  byte bVar12;
  byte *pbVar14;
  undefined7 in_register_00000089;
  byte *pbVar15;
  bool bVar16;
  ulong uVar17;
  TextTransform text_transformation;
  bool bVar18;
  float fVar19;
  float fVar20;
  char *next_token_begin;
  float local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  undefined4 local_dc;
  String token;
  StringView local_60;
  StringView local_50;
  TextShapingContext text_shaping_context;
  byte bVar13;
  
  local_dc = (undefined4)CONCAT71(in_register_00000089,trim_whitespace_prefix);
  local_ec = right_spacing_width;
  if ((maximum_line_width < 0.0) &&
     (bVar6 = Assert("RMLUI_ASSERT(maximum_line_width >= 0.f)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0xbc), !bVar6)) {
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
  FVar9 = Element::GetFontFaceHandle(&this->super_Element);
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  *line_length = 0;
  *line_width = 0.0;
  if (FVar9 == 0) {
    pEVar11 = Element::GetParentNode(&this->super_Element);
    if (pEVar11 != (Element *)0x0) {
      this = (ElementText *)Element::GetParentNode(&this->super_Element);
    }
    LogMissingFontFace(&this->super_Element);
    bVar6 = true;
  }
  else {
    this_00 = Element::GetComputedValues(&this->super_Element);
    bVar13 = (byte)((uint)*(undefined4 *)&(this_00->inherited).field_0x14 >> 0x18);
    bVar12 = bVar13 & 7;
    bVar16 = bVar12 == 4 || (bVar13 & 5) == 1;
    text_shaping_context.language = &(this_00->inherited).language;
    text_shaping_context.text_direction = bVar13 >> 5 & (Rtl|Ltr);
    text_shaping_context.letter_spacing = Style::ComputedValues::letter_spacing(this_00);
    uVar2 = *(uint *)&(this_00->inherited).field_0x14;
    text_transformation = (TextTransform)(uVar2 >> 0x14) & Lowercase;
    local_e8 = uVar2 >> 0x1b & 0xffffff03;
    pFVar10 = GetFontEngineInterface();
    pcVar3 = (this->text)._M_dataplus._M_p;
    pbVar15 = (byte *)(pcVar3 + line_begin);
    string_end = (byte *)(pcVar3 + (this->text)._M_string_length);
    local_e0 = (uint)bVar16;
    local_e4 = 0x15U >> bVar12 & 1;
    do {
      bVar6 = pbVar15 == string_end;
      if (bVar6) {
        return bVar6;
      }
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      token.field_2._M_local_buf[0] = '\0';
      sVar4 = line->_M_string_length;
      next_token_begin = (char *)pbVar15;
      if (sVar4 == 0) {
        uVar17 = 0;
        bVar18 = true;
      }
      else {
        pcVar3 = (line->_M_dataplus)._M_p;
        CVar7 = StringUtilities::ToCharacter(pcVar3 + (sVar4 - 1),pcVar3 + sVar4);
        uVar17 = (ulong)CVar7;
        bVar18 = line->_M_string_length == 0;
      }
      bVar18 = BuildToken(&token,&next_token_begin,(char *)string_end,
                          (bool)(bVar18 & (byte)local_dc),SUB41(local_e4,0),SUB41(local_e0,0),
                          text_transformation,decode_escape_characters);
      StringView::StringView(&local_50,&token);
      iVar8 = (*pFVar10->_vptr_FontEngineInterface[9])
                        (pFVar10,FVar9,local_50.p_begin,local_50.p_end,&text_shaping_context,uVar17)
      ;
      if ((0x19U >> bVar12 & 0.0 <= maximum_line_width) == 0) {
LAB_00230f9f:
        ::std::__cxx11::string::_M_append((char *)line,(ulong)token._M_dataplus._M_p);
        *line_length = *line_length + ((int)next_token_begin - (int)pbVar15);
        *line_width = (float)iVar8 + *line_width;
        if ((bVar18 == false) || ((bVar18 = false, !allow_empty && (line->_M_string_length == 0))))
        {
          bVar18 = true;
          pbVar15 = (byte *)next_token_begin;
        }
      }
      else {
        pbVar14 = (byte *)next_token_begin;
        if ((byte *)next_token_begin == string_end || ((0x15U >> bVar12 ^ 1) & 1) != 0) {
          fVar19 = *line_width;
          fVar20 = fVar19;
          if ((byte *)next_token_begin == string_end) goto LAB_00230da1;
        }
        else {
          do {
            bVar13 = *pbVar14;
            if (((0x20 < (ulong)bVar13) || ((0x100002600U >> ((ulong)bVar13 & 0x3f) & 1) == 0)) ||
               (bVar16 && bVar13 == 10)) {
              fVar19 = *line_width;
              fVar20 = fVar19;
              goto LAB_00230db8;
            }
            pbVar14 = pbVar14 + 1;
          } while (pbVar14 != string_end);
          fVar19 = *line_width;
LAB_00230da1:
          fVar20 = fVar19 + local_ec;
        }
LAB_00230db8:
        if (iVar8 <= (int)(maximum_line_width - fVar20)) goto LAB_00230f9f;
        if ((char)local_e8 == '\x01') {
LAB_00230df7:
          pbVar14 = pbVar15 + ((int)next_token_begin - (int)pbVar15);
          do {
            pbVar1 = pbVar14 + -1;
            pbVar14 = pbVar1;
            if (pbVar1 == pbVar15) {
              bVar18 = false;
              if ((allow_empty) ||
                 (pbVar14 = pbVar15 + 1, bVar18 = false, line->_M_string_length != 0))
              goto LAB_00230ffc;
            }
            token._M_string_length = 0;
            *token._M_dataplus._M_p = '\0';
            next_token_begin = (char *)pbVar15;
            BuildToken(&token,&next_token_begin,(char *)pbVar14,
                       (bool)(line->_M_string_length == 0 & (byte)local_dc),SUB41(local_e4,0),
                       SUB41(local_e0,0),text_transformation,decode_escape_characters);
            StringView::StringView(&local_60,&token);
            iVar8 = (*pFVar10->_vptr_FontEngineInterface[9])
                              (pFVar10,FVar9,local_60.p_begin,local_60.p_end,&text_shaping_context,
                               uVar17);
            bVar18 = true;
          } while ((pbVar1 != pbVar15) && ((int)(maximum_line_width - fVar19) < iVar8));
          goto LAB_00230f9f;
        }
        if ((char)local_e8 == '\x02') {
          if (line->_M_string_length == 0) goto LAB_00230df7;
        }
        else if ((!allow_empty) && (line->_M_string_length == 0)) goto LAB_00230f9f;
        bVar18 = false;
      }
LAB_00230ffc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)token._M_dataplus._M_p != &token.field_2) {
        operator_delete(token._M_dataplus._M_p,
                        CONCAT71(token.field_2._M_allocated_capacity._1_7_,
                                 token.field_2._M_local_buf[0]) + 1);
      }
    } while (bVar18);
  }
  return bVar6;
}

Assistant:

bool ElementText::GenerateLine(String& line, int& line_length, float& line_width, int line_begin, float maximum_line_width, float right_spacing_width,
	bool trim_whitespace_prefix, bool decode_escape_characters, bool allow_empty)
{
	RMLUI_ZoneScoped;
	RMLUI_ASSERT(
		maximum_line_width >= 0.f); // TODO: Check all callers for conformance, check break at line condition below. Possibly check for FLT_MAX.

	FontFaceHandle font_face_handle = GetFontFaceHandle();

	// Initialise the output variables.
	line.clear();
	line_length = 0;
	line_width = 0;

	// Bail if we don't have a valid font face.
	if (font_face_handle == 0)
	{
		LogMissingFontFace(GetParentNode() ? GetParentNode() : this);
		return true;
	}

	// Determine how we are processing white-space while formatting the text.
	using namespace Style;
	const auto& computed = GetComputedValues();
	WhiteSpace white_space_property = computed.white_space();
	bool collapse_white_space =
		white_space_property == WhiteSpace::Normal || white_space_property == WhiteSpace::Nowrap || white_space_property == WhiteSpace::Preline;
	bool break_at_line = (maximum_line_width >= 0) &&
		(white_space_property == WhiteSpace::Normal || white_space_property == WhiteSpace::Prewrap || white_space_property == WhiteSpace::Preline);
	bool break_at_endline =
		white_space_property == WhiteSpace::Pre || white_space_property == WhiteSpace::Prewrap || white_space_property == WhiteSpace::Preline;

	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};
	TextTransform text_transform_property = computed.text_transform();
	WordBreak word_break = computed.word_break();

	FontEngineInterface* font_engine_interface = GetFontEngineInterface();

	// Starting at the line_begin character, we generate sections of the text (we'll call them tokens) depending on the
	// white-space parsing parameters. Each section is then appended to the line if it can fit. If not, or if an
	// endline is found (and we're processing them), then the line is ended. kthxbai!
	const char* token_begin = text.c_str() + line_begin;
	const char* string_end = text.c_str() + text.size();
	while (token_begin != string_end)
	{
		String token;
		const char* next_token_begin = token_begin;
		Character previous_codepoint = Character::Null;
		if (!line.empty())
			previous_codepoint =
				StringUtilities::ToCharacter(StringUtilities::SeekBackwardUTF8(&line.back(), line.data()), line.data() + line.size());

		// Generate the next token and determine its pixel-length.
		bool break_line = BuildToken(token, next_token_begin, string_end, line.empty() && trim_whitespace_prefix, collapse_white_space,
			break_at_endline, text_transform_property, decode_escape_characters);
		int token_width = font_engine_interface->GetStringWidth(font_face_handle, token, text_shaping_context, previous_codepoint);

		// If we're breaking to fit a line box, check if the token can fit on the line before we add it.
		if (break_at_line)
		{
			const bool is_last_token = LastToken(next_token_begin, string_end, collapse_white_space, break_at_endline);
			int max_token_width = int(maximum_line_width - (is_last_token ? line_width + right_spacing_width : line_width));

			if (token_width > max_token_width)
			{
				if (word_break == WordBreak::BreakAll || (word_break == WordBreak::BreakWord && line.empty()))
				{
					// Try to break up the word
					max_token_width = int(maximum_line_width - line_width);
					const int token_max_size = int(next_token_begin - token_begin);
					const char* partial_string_end = token_begin + token_max_size;

					// @performance: Can be made much faster. Use string width heuristics and logarithmic search.
					while (true)
					{
						partial_string_end = StringUtilities::SeekBackwardUTF8(partial_string_end - 1, token_begin);

						bool force_loop_break_at_end = false;
						if (partial_string_end == token_begin)
						{
							// Not even the first character of the token fits. Let it overflow onto the next line if we can.
							if (allow_empty || !line.empty())
								return false;

							// Continue by forcing the first character to be consumed, even though it will overflow.
							partial_string_end = StringUtilities::SeekForwardUTF8(token_begin + 1, token_begin + token_max_size);
							force_loop_break_at_end = true;
						}

						token.clear();
						next_token_begin = token_begin;
						BuildToken(token, next_token_begin, partial_string_end, line.empty() && trim_whitespace_prefix, collapse_white_space,
							break_at_endline, text_transform_property, decode_escape_characters);
						token_width = font_engine_interface->GetStringWidth(font_face_handle, token, text_shaping_context, previous_codepoint);

						if (force_loop_break_at_end || token_width <= max_token_width)
							break;
					}

					break_line = true;
				}
				else if (allow_empty || !line.empty())
				{
					// Let the token overflow into the next line.
					return false;
				}
			}
		}

		// The token can fit on the end of the line, so add it onto the end and increment our width and length counters.
		line += token;
		line_length += (int)(next_token_begin - token_begin);
		line_width += token_width;

		// Break out of the loop if an endline was forced.
		if (break_line && (allow_empty || !line.empty()))
			return false;

		// Set the beginning of the next token.
		token_begin = next_token_begin;
	}

	return true;
}